

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * linearize_negate_condition(Proc *proc,int line_number,Pseudo *pseudo,Pseudo *not_pseudo)

{
  Instruction *insn;
  Pseudo *pseudo_00;
  
  insn = allocate_instruction(proc,op_not,line_number);
  pseudo_00 = add_instruction_operand(proc,insn,pseudo);
  free_temp_pseudo(proc,pseudo,false);
  add_instruction_target(proc,insn,not_pseudo);
  add_instruction(proc,insn);
  if (pseudo_00 != (Pseudo *)0x0) {
    free_temp_pseudo(proc,pseudo_00,false);
  }
  return not_pseudo;
}

Assistant:

static Pseudo *linearize_negate_condition(Proc *proc, int line_number, Pseudo *pseudo, Pseudo *not_pseudo) {
	Instruction *not_insn = allocate_instruction(proc, op_not, line_number);
	Pseudo *tofree = add_instruction_operand(proc, not_insn, pseudo);
	free_temp_pseudo(proc, pseudo, false);//CHECK
	add_instruction_target(proc, not_insn, not_pseudo);
	add_instruction(proc, not_insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
	return not_pseudo;
}